

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_accelerator_intel
clCreateAcceleratorINTEL
          (cl_context context,cl_accelerator_type_intel accelerator_type,size_t descriptor_size,
          void *descriptor,cl_int *errcode_ret)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ulong enqueueCounter;
  CLIntercept *this;
  cl_platform_id p_Var3;
  mapped_type *pmVar4;
  time_point end;
  _Base_ptr p_Var5;
  cl_motion_estimation_desc_intel *desc;
  _Base_ptr p_Var6;
  time_point local_80;
  cl_int localErrorCode;
  undefined1 local_60 [32];
  ulong local_40;
  _func_cl_accelerator_intel_cl_context_cl_accelerator_type_intel_size_t_void_ptr_cl_int_ptr
  *local_38;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) goto LAB_00136669;
  p_Var3 = CLIntercept::getPlatform(g_pIntercept,context);
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[*(cl_platform_id *)(p_Var6 + 1) < p_Var3]) {
    if (*(cl_platform_id *)(p_Var6 + 1) >= p_Var3) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var6 = p_Var5, p_Var3 < *(cl_platform_id *)(p_Var5 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    local_60._0_8_ = (key_type)0x0;
    pmVar4 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_60);
  }
  else {
    pmVar4 = (mapped_type *)&p_Var6[1]._M_parent;
  }
  local_38 = pmVar4->clCreateAcceleratorINTEL;
  if (local_38 !=
      (_func_cl_accelerator_intel_cl_context_cl_accelerator_type_intel_size_t_void_ptr_cl_int_ptr *)
      0x0) {
    enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
    bVar2 = (this->m_Config).CallLogging;
    if (descriptor_size < 0x10 || accelerator_type != 0) {
      if (bVar2 != false) {
        CLIntercept::callLoggingEnter
                  (this,"clCreateAcceleratorINTEL",enqueueCounter,(cl_kernel)0x0,
                   "context = %p, accelerator_type = %u",context,accelerator_type);
      }
    }
    else if (bVar2 != false) {
      local_40 = (ulong)*(uint *)((long)descriptor + 4);
      CLIntercept::callLoggingEnter
                (this,"clCreateAcceleratorINTEL",enqueueCounter,(cl_kernel)0x0,
                 "context = %p, motion_estimation_desc[ mb_block_type = %u, subpixel_mode = %u, sad_adjust_mode = %u, search_path_type = %u ]"
                 ,context,(ulong)*descriptor,local_40,(ulong)*(uint *)((long)descriptor + 8),
                 (ulong)*(uint *)((long)descriptor + 0xc));
    }
    localErrorCode = 0;
    if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
       ((this->m_Config).ErrorAssert == false)) {
      if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_00136487:
        errcode_ret = &localErrorCode;
      }
    }
    else if (errcode_ret == (cl_int *)0x0) goto LAB_00136487;
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      local_80.__d.__r = (duration)0;
    }
    else {
      local_80.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    descriptor = (*pmVar4->clCreateAcceleratorINTEL)
                           (context,accelerator_type,descriptor_size,descriptor,errcode_ret);
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      end.__d.__r = (duration)0;
    }
    else {
      end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_60._0_8_ = (key_type)(local_60 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
        CLIntercept::updateHostTimingStats
                  (this,"clCreateAcceleratorINTEL",(string *)local_60,local_80,end);
        if ((key_type)local_60._0_8_ != (key_type)(local_60 + 0x10)) {
          operator_delete((void *)local_60._0_8_);
        }
      }
    }
    bVar2 = (this->m_Config).ErrorLogging;
    if ((((bVar2 != false) || ((this->m_Config).ErrorAssert != false)) ||
        ((this->m_Config).NoErrors == true)) && (*errcode_ret != 0)) {
      if (bVar2 != false) {
        CLIntercept::logError(this,"clCreateAcceleratorINTEL",*errcode_ret);
      }
      if ((this->m_Config).ErrorAssert == true) {
        raise(5);
      }
      if ((this->m_Config).NoErrors == true) {
        *errcode_ret = 0;
      }
    }
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::callLoggingExit
                (this,"clCreateAcceleratorINTEL",*errcode_ret,(cl_event *)0x0,
                 (cl_sync_point_khr *)0x0,"returned %p",descriptor);
    }
    if ((this->m_Config).ChromeCallLogging == true) {
      local_60._0_8_ = (key_type)(local_60 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
      CLIntercept::chromeCallLoggingExit
                (this,"clCreateAcceleratorINTEL",(string *)local_60,false,0,local_80,end);
      if ((key_type)local_60._0_8_ != (key_type)(local_60 + 0x10)) {
        operator_delete((void *)local_60._0_8_);
      }
    }
    if ((cl_accelerator_intel)descriptor != (cl_accelerator_intel)0x0) {
      CLIntercept::addAcceleratorInfo(this,(cl_accelerator_intel)descriptor,context);
    }
  }
  if (local_38 !=
      (_func_cl_accelerator_intel_cl_context_cl_accelerator_type_intel_size_t_void_ptr_cl_int_ptr *)
      0x0) {
    return (cl_accelerator_intel)descriptor;
  }
LAB_00136669:
  if (errcode_ret != (cl_int *)0x0) {
    *errcode_ret = -0x22;
  }
  return (cl_accelerator_intel)0x0;
}

Assistant:

CL_API_ENTRY cl_accelerator_intel CL_API_CALL clCreateAcceleratorINTEL(
    cl_context context,
    cl_accelerator_type_intel accelerator_type,
    size_t descriptor_size,
    const void* descriptor,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clCreateAcceleratorINTEL )
        {
            GET_ENQUEUE_COUNTER();

            if( ( accelerator_type == CL_ACCELERATOR_TYPE_MOTION_ESTIMATION_INTEL ) &&
                ( descriptor_size >= sizeof( cl_motion_estimation_desc_intel ) ) )
            {
                cl_motion_estimation_desc_intel* desc =
                    (cl_motion_estimation_desc_intel*)descriptor;
                CALL_LOGGING_ENTER( "context = %p, motion_estimation_desc[ mb_block_type = %u, subpixel_mode = %u, sad_adjust_mode = %u, search_path_type = %u ]",
                    context,
                    desc->mb_block_type,
                    desc->subpixel_mode,
                    desc->sad_adjust_mode,
                    desc->search_path_type );
            }
            else
            {
                CALL_LOGGING_ENTER( "context = %p, accelerator_type = %u",
                    context,
                    accelerator_type );
            }
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            cl_accelerator_intel retVal = dispatchX.clCreateAcceleratorINTEL(
                context,
                accelerator_type,
                descriptor_size,
                descriptor,
                errcode_ret);

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( errcode_ret[0] );
            //ADD_OBJECT_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            if( retVal != NULL )
            {
                pIntercept->addAcceleratorInfo(
                    retVal,
                    context );
            }

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}